

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-eintr-handling.c
# Opt level: O1

int run_test_eintr_handling(void)

{
  uv_loop_t *loop;
  int iVar1;
  uv_signal_t *handle;
  int64_t eval_b_3;
  int64_t eval_a_3;
  uv_thread_t thread;
  thread_ctx ctx;
  uv_signal_t signal;
  undefined1 local_b8 [56];
  uv_signal_t local_80;
  
  iov = uv_buf_init(buf,0x20);
  ::loop = uv_default_loop();
  iVar1 = uv_signal_init(::loop,(uv_signal_t *)(local_b8 + 0x38));
  local_b8._16_8_ = SEXT48(iVar1);
  local_b8._8_8_ = (uv_loop_t *)0x0;
  if (local_b8._16_8_ == 0) {
    iVar1 = uv_signal_start((uv_signal_t *)(local_b8 + 0x38),sig_func,10);
    local_b8._16_8_ = SEXT48(iVar1);
    local_b8._8_8_ = (uv_loop_t *)0x0;
    if (local_b8._16_8_ != 0) goto LAB_00181dcb;
    iVar1 = pipe(pipe_fds);
    local_b8._16_8_ = SEXT48(iVar1);
    local_b8._8_8_ = (uv_loop_t *)0x0;
    if (local_b8._16_8_ != 0) goto LAB_00181dda;
    iVar1 = uv_thread_create((uv_thread_t *)(local_b8 + 8),thread_main,local_b8 + 0x10);
    local_b8._0_8_ = SEXT48(iVar1);
    if ((void *)local_b8._0_8_ != (void *)0x0) goto LAB_00181de9;
    iVar1 = uv_fs_read(::loop,&read_req,pipe_fds[0],&iov,1,-1,(uv_fs_cb)0x0);
    local_b8._0_8_ = SEXT48(iVar1);
    if ((void *)local_b8._0_8_ != (void *)0xd) goto LAB_00181df8;
    iVar1 = strcmp(buf,test_buf);
    local_b8._0_8_ = SEXT48(iVar1);
    if ((void *)local_b8._0_8_ != (void *)0x0) goto LAB_00181e07;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    local_b8._0_8_ = SEXT48(iVar1);
    if ((void *)local_b8._0_8_ != (void *)0x0) goto LAB_00181e16;
    iVar1 = close(pipe_fds[0]);
    local_b8._0_8_ = SEXT48(iVar1);
    if ((void *)local_b8._0_8_ != (void *)0x0) goto LAB_00181e25;
    iVar1 = close(pipe_fds[1]);
    local_b8._0_8_ = SEXT48(iVar1);
    if ((void *)local_b8._0_8_ != (void *)0x0) goto LAB_00181e34;
    uv_close((uv_handle_t *)(local_b8 + 0x38),(uv_close_cb)0x0);
    iVar1 = uv_thread_join((uv_thread_t *)(local_b8 + 8));
    loop = ::loop;
    local_b8._0_8_ = SEXT48(iVar1);
    if ((void *)local_b8._0_8_ == (void *)0x0) {
      uv_walk(::loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      local_b8._0_8_ = (void *)0x0;
      iVar1 = uv_loop_close(::loop);
      if ((void *)local_b8._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00181e52;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_00181dcb:
    run_test_eintr_handling_cold_2();
LAB_00181dda:
    run_test_eintr_handling_cold_3();
LAB_00181de9:
    run_test_eintr_handling_cold_4();
LAB_00181df8:
    run_test_eintr_handling_cold_5();
LAB_00181e07:
    run_test_eintr_handling_cold_6();
LAB_00181e16:
    run_test_eintr_handling_cold_7();
LAB_00181e25:
    run_test_eintr_handling_cold_8();
LAB_00181e34:
    run_test_eintr_handling_cold_9();
  }
  run_test_eintr_handling_cold_10();
LAB_00181e52:
  handle = (uv_signal_t *)local_b8;
  run_test_eintr_handling_cold_11();
  if ((handle->flags & 3) == 0) {
    uv__signal_stop(handle);
    return 0;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/signal.c"
                ,0x1e8,"int uv_signal_stop(uv_signal_t *)");
}

Assistant:

TEST_IMPL(eintr_handling) {
  struct thread_ctx ctx;
  uv_thread_t thread;
  uv_signal_t signal;
  int nread;

  iov = uv_buf_init(buf, sizeof(buf));
  loop = uv_default_loop();

  ASSERT_OK(uv_signal_init(loop, &signal));
  ASSERT_OK(uv_signal_start(&signal, sig_func, SIGUSR1));

  ASSERT_OK(pipe(pipe_fds));
  ASSERT_OK(uv_thread_create(&thread, thread_main, &ctx));

  nread = uv_fs_read(loop, &read_req, pipe_fds[0], &iov, 1, -1, NULL);

  ASSERT_EQ(nread, sizeof(test_buf));
  ASSERT_OK(strcmp(buf, test_buf));

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_OK(close(pipe_fds[0]));
  ASSERT_OK(close(pipe_fds[1]));
  uv_close((uv_handle_t*) &signal, NULL);

  ASSERT_OK(uv_thread_join(&thread));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}